

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O2

int __thiscall
DirectionalScannerO1::nextOnLeft
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  pointer pPVar1;
  bool *pbVar2;
  int iVar3;
  int iVar4;
  int x;
  int iVar5;
  int iVar6;
  bool *pbVar7;
  int y;
  Pt2i PStack_38;
  
  if (((this->super_DirectionalScanner).clearance == true) &&
     (pPVar1 = (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
     _M_finish != pPVar1)) {
    (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pPVar1;
  }
  if (this->lstop == true) {
    y = (this->super_DirectionalScanner).lcy + -1;
    (this->super_DirectionalScanner).lcy = y;
    pbVar7 = (this->super_DirectionalScanner).lst2 + -1;
    (this->super_DirectionalScanner).lst2 = pbVar7;
    pbVar2 = (this->super_DirectionalScanner).steps;
    if (pbVar7 < pbVar2) {
      pbVar7 = (this->super_DirectionalScanner).fs + -1;
      (this->super_DirectionalScanner).lst2 = pbVar7;
    }
    this->lstop = false;
    x = (this->super_DirectionalScanner).lcx;
  }
  else {
    pbVar2 = (this->super_DirectionalScanner).steps;
    pbVar7 = this->lst1 + -1;
    this->lst1 = pbVar7;
    if (pbVar7 < pbVar2) {
      pbVar7 = (this->super_DirectionalScanner).fs + -1;
      this->lst1 = pbVar7;
    }
    iVar3 = (this->super_DirectionalScanner).lcy;
    x = (this->super_DirectionalScanner).lcx + -1;
    (this->super_DirectionalScanner).lcx = x;
    if (*pbVar7 == false) {
      pbVar7 = (this->super_DirectionalScanner).lst2;
      y = iVar3;
    }
    else {
      y = iVar3 + -1;
      (this->super_DirectionalScanner).lcy = y;
      pbVar7 = (this->super_DirectionalScanner).lst2 + -1;
      (this->super_DirectionalScanner).lst2 = pbVar7;
      if (pbVar7 < pbVar2) {
        pbVar7 = (this->super_DirectionalScanner).fs + -1;
        (this->super_DirectionalScanner).lst2 = pbVar7;
      }
      if (*pbVar7 == true) {
        pbVar7 = pbVar7 + 1;
        if ((this->super_DirectionalScanner).fs <= pbVar7) {
          pbVar7 = pbVar2;
        }
        (this->super_DirectionalScanner).lst2 = pbVar7;
        (this->super_DirectionalScanner).lcy = iVar3;
        this->lstop = true;
        y = iVar3;
      }
    }
  }
  iVar3 = (this->super_DirectionalScanner).dla;
  iVar4 = (this->super_DirectionalScanner).dlb;
  iVar5 = (this->super_DirectionalScanner).dlc2;
  for (iVar6 = y * iVar4;
      (((this->super_DirectionalScanner).xmax <= x || (y < (this->super_DirectionalScanner).ymin))
      && (iVar5 <= iVar3 * x + iVar6)); iVar6 = iVar6 + iVar4) {
    x = x - (uint)*pbVar7;
    y = y + 1;
    pbVar7 = pbVar7 + 1;
    if ((this->super_DirectionalScanner).fs <= pbVar7) {
      pbVar7 = pbVar2;
    }
  }
  for (; ((iVar5 <= iVar4 * y + iVar3 * x && ((this->super_DirectionalScanner).xmin <= x)) &&
         (y < (this->super_DirectionalScanner).ymax)); y = y + 1) {
    Pt2i::Pt2i(&PStack_38,x,y);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
    pbVar2 = pbVar7 + 1;
    if ((this->super_DirectionalScanner).fs <= pbVar2) {
      pbVar2 = (this->super_DirectionalScanner).steps;
    }
    x = x - (uint)*pbVar7;
    iVar3 = (this->super_DirectionalScanner).dla;
    iVar4 = (this->super_DirectionalScanner).dlb;
    iVar5 = (this->super_DirectionalScanner).dlc2;
    pbVar7 = pbVar2;
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::nextOnLeft (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (lstop)
  {
    lcy --;
    if (--lst2 < steps) lst2 = fs - 1;
    lstop = false;
  }
  else
  {
    if (--lst1 < steps) lst1 = fs - 1;
    lcx --;
    if (*lst1)
    {
      lcy --;
      if (--lst2 < steps) lst2 = fs - 1;
      if (*lst2)
      {
        if (++lst2 >= fs) lst2 = steps;
        lcy ++;
        lstop = true;
      }
    }
  }

  // Computes the next scan
  int x = lcx;
  int y = lcy;
  bool *nst = lst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}